

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

hugeint_t __thiscall
duckdb::Interpolator<false>::Extract<duckdb::hugeint_t,duckdb::hugeint_t>
          (Interpolator<false> *this,hugeint_t *dest,Vector *result)

{
  hugeint_t hVar1;
  hugeint_t hi;
  hugeint_t lo;
  hugeint_t local_40;
  hugeint_t local_30;
  
  if (this->CRN == this->FRN) {
    hVar1 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>
                      ((CastInterpolation *)dest,(hugeint_t *)result,result);
    return hVar1;
  }
  local_30 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>
                       ((CastInterpolation *)dest,(hugeint_t *)result,result);
  local_40 = CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>
                       ((CastInterpolation *)(dest + 1),(hugeint_t *)result,(Vector *)local_30.upper
                       );
  hVar1 = CastInterpolation::Interpolate<duckdb::hugeint_t>
                    (&local_30,
                     this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),&local_40);
  return hVar1;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}